

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::GetLinkLibsCMP0065
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *linkLanguage,
          cmGeneratorTarget *tgt)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  cmState *this_01;
  ostream *poVar4;
  PolicyID id;
  PolicyID id_00;
  allocator local_1ca;
  allocator local_1c9;
  string local_1c8;
  ostringstream w;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TVar2 = cmGeneratorTarget::GetType(tgt);
  if (TVar2 != EXECUTABLE) {
    return __return_storage_ptr__;
  }
  this_01 = cmStateSnapshot::GetState(&this->StateSnapshot);
  std::__cxx11::string::string((string *)&w,"TARGET_SUPPORTS_SHARED_LIBS",(allocator *)&local_1c8);
  bVar1 = cmState::GetGlobalPropertyAsBool(this_01,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0065(tgt);
  switch(PVar3) {
  case OLD:
    break;
  case WARN:
    std::__cxx11::string::string((string *)&w,"ENABLE_EXPORTS",&local_1c9);
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(tgt,(string *)&w);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&w);
    }
    else {
      this_00 = this->Makefile;
      std::__cxx11::string::string((string *)&local_1c8,"CMAKE_POLICY_WARNING_CMP0065",&local_1ca);
      bVar1 = cmMakefile::PolicyOptionalWarningEnabled(this_00,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&w);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x41,id_00);
        poVar4 = std::operator<<((ostream *)&w,(string *)&local_1c8);
        std::operator<<(poVar4,
                        "\nFor compatibility with older versions of CMake, additional flags may be added to export symbols on all executables regardless of their ENABLE_EXPORTS property."
                       );
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::stringbuf::str();
        IssueMessage(this,AUTHOR_WARNING,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
      }
    }
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&w,(cmPolicies *)0x41,id);
    IssueMessage(this,FATAL_ERROR,(string *)&w);
    std::__cxx11::string::~string((string *)&w);
  case NEW:
    std::__cxx11::string::string((string *)&w,"ENABLE_EXPORTS",(allocator *)&local_1c8);
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(tgt,(string *)&w);
    std::__cxx11::string::~string((string *)&w);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    break;
  default:
    goto switchD_00303486_default;
  }
  std::__cxx11::string::string((string *)&w,"CMAKE_SHARED_LIBRARY_LINK_",(allocator *)&local_1c8);
  std::__cxx11::string::append((string *)&w);
  std::__cxx11::string::append((char *)&w);
  cmMakefile::GetSafeDefinition(this->Makefile,(string *)&w);
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&w);
switchD_00303486_default:
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetLinkLibsCMP0065(
  std::string const& linkLanguage, cmGeneratorTarget& tgt) const
{
  std::string linkFlags;

  // Flags to link an executable to shared libraries.
  if (tgt.GetType() == cmStateEnums::EXECUTABLE &&
      this->StateSnapshot.GetState()->GetGlobalPropertyAsBool(
        "TARGET_SUPPORTS_SHARED_LIBS")) {
    bool add_shlib_flags = false;
    switch (tgt.GetPolicyStatusCMP0065()) {
      case cmPolicies::WARN:
        if (!tgt.GetPropertyAsBool("ENABLE_EXPORTS") &&
            this->Makefile->PolicyOptionalWarningEnabled(
              "CMAKE_POLICY_WARNING_CMP0065")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0065) << "\n"
            "For compatibility with older versions of CMake, "
            "additional flags may be added to export symbols on all "
            "executables regardless of their ENABLE_EXPORTS property.";
          /* clang-format on */
          this->IssueMessage(cmake::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to always add the flags
        add_shlib_flags = true;
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          cmake::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0065));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to only add the flags if ENABLE_EXPORTS is on
        add_shlib_flags = tgt.GetPropertyAsBool("ENABLE_EXPORTS");
        break;
    }

    if (add_shlib_flags) {
      std::string linkFlagsVar = "CMAKE_SHARED_LIBRARY_LINK_";
      linkFlagsVar += linkLanguage;
      linkFlagsVar += "_FLAGS";
      linkFlags = this->Makefile->GetSafeDefinition(linkFlagsVar);
    }
  }
  return linkFlags;
}